

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int Curl_resolv_getsock(Curl_easy *data,curl_socket_t *socks)

{
  thread_data *ptVar1;
  undefined1 (*pauVar2) [12];
  ulong uVar3;
  ulong milli;
  int iVar4;
  curltime cVar5;
  curltime newer;
  
  if (((data->conn->bits).field_0x3 & 2) != 0) {
    return 0;
  }
  ptVar1 = (data->state).async.tdata;
  if (ptVar1 == (thread_data *)0x0) {
    pauVar2 = (undefined1 (*) [12])(data->state).async.resolver;
    cVar5 = Curl_now();
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar5._0_12_,0);
    newer.tv_usec = SUB124(cVar5._0_12_,8);
    cVar5._12_4_ = 0;
    cVar5._0_12_ = *pauVar2;
    uVar3 = Curl_timediff(newer,cVar5);
    iVar4 = 0;
    if ((long)uVar3 < 3) {
      milli = 0;
    }
    else if (uVar3 < 0x33) {
      milli = (ulong)(((uint)uVar3 & 0xff) / 3);
    }
    else {
      milli = 200;
      if (uVar3 < 0xfb) {
        milli = 0x32;
      }
    }
    Curl_expire(data,milli,EXPIRE_ASYNC_NAME);
  }
  else {
    *socks = (ptVar1->tsd).sock_pair[0];
    (ptVar1->tsd).data = data;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Curl_resolv_getsock(struct Curl_easy *data,
                        curl_socket_t *socks)
{
#ifdef CURLRES_ASYNCH
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh)
    /* nothing to wait for during DoH resolve, those handles have their own
       sockets */
    return GETSOCK_BLANK;
#endif
  return Curl_resolver_getsock(data, socks);
#else
  (void)data;
  (void)socks;
  return GETSOCK_BLANK;
#endif
}